

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::RleBpDecoder::GetBatch<unsigned_char>
          (RleBpDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t __len;
  
  uVar2 = 0;
LAB_00dc452d:
  do {
    uVar1 = batch_size - uVar2;
    if (batch_size < uVar2 || uVar1 == 0) {
      return;
    }
    uVar3 = this->repeat_count_;
    if (uVar3 == 0) {
      uVar3 = this->literal_count_;
      if (uVar3 == 0) {
        NextCounts(this);
        goto LAB_00dc452d;
      }
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      ParquetDecodeUtils::BitUnpack<unsigned_char>
                (&this->buffer_,&this->bitpack_pos,values_target_ptr + uVar2,(ulong)uVar3,
                 (bitpacking_width_t)this->bit_width_);
      this->literal_count_ = this->literal_count_ - uVar3;
    }
    else {
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      switchD_0049f7f1::default(values_target_ptr + uVar2,(int)this->current_value_,(ulong)uVar3);
      this->repeat_count_ = this->repeat_count_ - uVar3;
    }
    uVar2 = uVar2 + uVar3;
  } while( true );
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, const uint32_t batch_size) {
		auto values = reinterpret_cast<T *>(values_target_ptr);
		uint32_t values_read = 0;

		while (values_read < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_read, repeat_count_);
				std::fill_n(values + values_read, repeat_batch, static_cast<T>(current_value_));
				repeat_count_ -= repeat_batch;
				values_read += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_read, literal_count_);
				ParquetDecodeUtils::BitUnpack<T>(buffer_, bitpack_pos, values + values_read, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_read += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_read == batch_size);
	}